

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiment_helpers.cpp
# Opt level: O3

void opengv::printEssentialMatrix(translation_t *position,rotation_t *rotation)

{
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pDVar1;
  double dVar2;
  undefined8 uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  long lVar6;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pDVar7;
  ostream *poVar8;
  size_t r;
  long lVar9;
  undefined8 *extraout_RDX;
  undefined8 *puVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  essential_t E;
  undefined8 auStack_60 [2];
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_50 [72];
  
  dVar16 = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
           .array[2];
  auVar21._8_8_ = 0x8000000000000000;
  auVar21._0_8_ = 0x8000000000000000;
  dVar2 = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[1];
  auVar22._8_8_ = dVar2;
  auVar22._0_8_ = dVar2;
  lVar6 = 0x10;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar16;
  auVar17._0_8_ = -dVar16;
  auVar18 = vpunpcklqdq_avx((undefined1  [16])0x0,auVar20);
  auVar20 = *(undefined1 (*) [16])
             (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
             m_data.array;
  auVar21 = vpunpcklqdq_avx(auVar22,auVar20 ^ auVar21);
  do {
    uVar3 = *(undefined8 *)
             ((long)(rotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                    m_storage.m_data.array + lVar6 + -0x10);
    auVar12._8_8_ = uVar3;
    auVar12._0_8_ = uVar3;
    auVar12 = vmulpd_avx512vl(auVar18,auVar12);
    dVar16 = *(double *)
              ((long)(rotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                     m_storage.m_data.array + lVar6);
    auVar23._8_8_ = dVar16;
    auVar23._0_8_ = dVar16;
    auVar22 = vpermilpd_avx(*(undefined1 (*) [16])
                             ((long)(rotation->
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                    m_storage.m_data.array + lVar6 + -0x10),1);
    uVar3 = *(undefined8 *)
             ((long)(rotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                    m_storage.m_data.array + lVar6 + -8);
    auVar5._8_8_ = uVar3;
    auVar5._0_8_ = uVar3;
    auVar17._8_8_ = 0;
    auVar12 = vfmadd231pd_avx512vl(auVar12,auVar17,auVar5);
    auVar12 = vfmadd231pd_fma(auVar12,auVar21,auVar23);
    auVar24._0_8_ = auVar20._0_8_ * auVar22._0_8_;
    auVar24._8_8_ = auVar20._8_8_ * auVar22._8_8_;
    auVar22 = vshufpd_avx(auVar24,auVar24,1);
    *(undefined1 (*) [16])((long)auStack_60 + lVar6) = auVar12;
    *(double *)(local_50 + lVar6) = (auVar24._0_8_ + dVar16 * 0.0) - auVar22._0_8_;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x58);
  dVar16 = 0.0;
  pDVar7 = local_50;
  lVar6 = 0;
  do {
    lVar9 = 0;
    do {
      pDVar1 = pDVar7 + lVar9;
      lVar9 = lVar9 + 0x18;
      dVar16 = dVar16 + *(double *)pDVar1 * *(double *)pDVar1;
    } while (lVar9 != 0x48);
    lVar6 = lVar6 + 1;
    pDVar7 = pDVar7 + 8;
  } while (lVar6 != 3);
  if (dVar16 < 0.0) {
    auStack_60[0] = 0x250cf6;
    dVar16 = sqrt(dVar16);
    puVar10 = extraout_RDX;
  }
  else {
    auVar18._8_8_ = 0;
    auVar18._0_8_ = dVar16;
    auVar20 = vsqrtsd_avx(auVar18,auVar18);
    dVar16 = auVar20._0_8_;
    puVar10 = (undefined8 *)0x48;
  }
  auVar19._8_8_ = dVar16;
  auVar19._0_8_ = dVar16;
  auVar19._16_8_ = dVar16;
  auVar19._24_8_ = dVar16;
  auVar13 = vpbroadcastq_avx512vl();
  auVar13 = vpaddq_avx2(auVar13,_DAT_002584e0);
  uVar11 = CONCAT71((int7)((ulong)lVar6 >> 8),7) & 0xffffffff;
  lVar6 = 0;
  do {
    auVar14 = vpbroadcastq_avx512vl();
    lVar6 = lVar6 + 1;
    auVar14 = vpsllq_avx2(auVar14,3);
    auVar4 = vpaddq_avx2(auVar13,auVar14);
    auVar14 = vgatherqpd_avx512vl(*puVar10);
    auVar15._8_8_ = (ulong)((byte)(uVar11 >> 1) & 1) * auVar14._8_8_;
    auVar15._0_8_ = (ulong)((byte)uVar11 & 1) * auVar14._0_8_;
    auVar15._16_8_ = (ulong)((byte)(uVar11 >> 2) & 1) * auVar14._16_8_;
    auVar15._24_8_ = 0;
    auVar14 = vdivpd_avx(auVar15,auVar19);
    vscatterqpd_avx512vl(ZEXT832(0) + auVar4,uVar11,auVar14);
  } while (lVar6 != 3);
  auStack_60[0] = 0x250d74;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"the random essential matrix is:",0x1f);
  auStack_60[0] = 0x250d88;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  auStack_60[0] = 0x250d93;
  std::ostream::put('X');
  auStack_60[0] = 0x250d9b;
  std::ostream::flush();
  auStack_60[0] = 0x250da8;
  poVar8 = Eigen::operator<<((ostream *)&std::cout,local_50);
  auStack_60[0] = 0x250dbf;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  auStack_60[0] = 0x250dca;
  std::ostream::put((char)poVar8);
  auStack_60[0] = 0x250dd2;
  std::ostream::flush();
  return;
}

Assistant:

void
opengv::printEssentialMatrix(
    const translation_t & position,
    const rotation_t & rotation)
{
  //E transforms vectors from vp 2 to 1: x_1^T * E * x_2 = 0
  //and E = (t)_skew*R
  Eigen::Matrix3d t_skew = Eigen::Matrix3d::Zero();
  t_skew(0,1) = -position[2];
  t_skew(0,2) = position[1];
  t_skew(1,0) = position[2];
  t_skew(1,2) = -position[0];
  t_skew(2,0) = -position[1];
  t_skew(2,1) = position[0];

  essential_t E = t_skew * rotation;
  double matrixNorm = 0.0;
  for(size_t r = 0; r < 3; r++)
  {
    for(size_t c = 0; c < 3; c++)
      matrixNorm += pow(E(r,c),2);
  }
  matrixNorm = sqrt(matrixNorm);
  for(size_t r = 0; r < 3; r++)
  {
    for(size_t c = 0; c < 3; c++)
      E(r,c) = E(r,c) / matrixNorm;
  }

  std::cout << "the random essential matrix is:" << std::endl;
  std::cout << E << std::endl;
}